

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_parse_cfg.c
# Opt level: O1

int mpp_parse_config(char *cfg_url,rc_test_config *ea)

{
  int iVar1;
  char *pcVar2;
  int iVar3;
  long lVar4;
  int *piVar5;
  cfg_file cfg;
  cfg_file local_c0;
  
  if ((cfg_url == (char *)0x0) || (*cfg_url == '\0')) {
    _mpp_log_l(2,0,"invalid input config url\n",0);
  }
  else {
    local_c0.file = (FILE *)fopen(cfg_url,"rb");
    if ((FILE *)local_c0.file == (FILE *)0x0) {
      _mpp_log_l(2,0,"fopen %s failed\n",0,cfg_url);
    }
    else {
      local_c0.cache_on = 0;
      do {
        pcVar2 = read_cfg_line(&local_c0);
        if (pcVar2 == (char *)0x0) {
          iVar1 = 3;
        }
        else {
          local_c0.cache_on = 0;
          iVar3 = 0;
          iVar1 = 0;
          if (*pcVar2 == '[') {
            iVar1 = lookup_opt_type(pcVar2);
            if (iVar1 == 0) {
              pcVar2 = read_cfg_line(&local_c0);
              while (((iVar1 = iVar3, pcVar2 != (char *)0x0 && (*pcVar2 != '\n')) &&
                     (*pcVar2 != '['))) {
                iVar1 = lookup_opt_type(pcVar2);
                if (iVar1 == 3) {
                  pcVar2 = get_opt_value(pcVar2);
                  __isoc99_sscanf(pcVar2,"%d",&ea->loop);
                  _mpp_log_l(4,0,"loop num: %d\n",0,ea->loop);
                }
                else if (iVar1 == 2) {
                  pcVar2 = get_opt_value(pcVar2);
                  iVar1 = lookup_opt_type(pcVar2);
                  ea->idx_type = iVar1;
                }
                local_c0.cache_on = 0;
                pcVar2 = read_cfg_line(&local_c0);
              }
            }
            else if (iVar1 == 1) {
              lVar4 = 0;
              piVar5 = &ea->event[0].bps;
              do {
                pcVar2 = read_cfg_line(&local_c0);
                if (((pcVar2 == (char *)0x0) || (*pcVar2 == '\n')) || (*pcVar2 == '[')) {
                  ea->event_cnt = (int)lVar4;
                  iVar1 = 0;
                  break;
                }
                iVar1 = 0;
                __isoc99_sscanf(pcVar2,"%d\t%d\t%f",(rc_event *)(piVar5 + -2),piVar5,piVar5 + -1);
                _mpp_log_l((double)(float)piVar5[-1],4,0,"idx: %d, bps %u, fps: %f\n",0,
                           (((rc_event *)(piVar5 + -2))->field_0).msec,*piVar5);
                local_c0.cache_on = 0;
                lVar4 = lVar4 + 1;
                piVar5 = piVar5 + 3;
              } while (lVar4 != 0x80);
            }
            else {
              _mpp_log_l(2,0,"invalid config type find\n",0);
              fclose((FILE *)local_c0.file);
              iVar1 = 1;
            }
          }
        }
      } while (iVar1 == 0);
      if (iVar1 == 3) {
        fclose((FILE *)local_c0.file);
        return 0;
      }
    }
  }
  return -1;
}

Assistant:

int mpp_parse_config(char *cfg_url, struct rc_test_config *ea)
{
    struct cfg_file cfg;

    if (cfg_url == NULL || strlen(cfg_url) == 0) {
        mpp_err("invalid input config url\n");
        return -1;
    }

    cfg.file = fopen(cfg_url, "rb");
    if (cfg.file == NULL) {
        mpp_err("fopen %s failed\n", cfg_url);
        return -1;
    }
    cfg.cache_on = 0;

    while (1) {
        char *line = read_cfg_line(&cfg);

        if (!line)
            break;

        invalid_cfg_cache(&cfg);
        if (line[0] == '[') {
            int type = lookup_opt_type(line);

            switch (type) {
            case CONFIG_TYPE_EVENT:
                parse_events(&cfg, ea);
                break;
            case CONFIG_TYPE_OPTION:
                parse_options(&cfg, ea);
                break;
            default:
                mpp_err("invalid config type find\n");
                fclose(cfg.file);
                return -1;
            }
        }
    }

    fclose(cfg.file);

    return 0;
}